

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O1

Board * create_Board(Board *board,int row,int col)

{
  long lVar1;
  Ship ship;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined3 uVar5;
  undefined4 uVar6;
  int row_00;
  int col_00;
  pointer pSVar7;
  ulong uVar8;
  ulong in_RCX;
  Ship *ship_00;
  int iVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  undefined8 in_stack_ffffffffffffff90;
  
  if ((board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar9 = 0;
    do {
      bVar11 = board->row == 0;
      bVar12 = board->column == 0;
      ship_00 = (Ship *)CONCAT71((int7)(in_RCX >> 8),bVar12 || bVar11);
      if (!bVar12 && !bVar11) {
        iVar10 = 0;
        do {
          row_00 = generate_random_number(row);
          col_00 = generate_random_number(col);
          bVar11 = validation(board,row_00,col_00,ship_00);
          if (bVar11) {
            ship_00 = (board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar9;
            val_Orientation(board,row_00,col_00,ship_00);
            pSVar7 = (board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (pSVar7[iVar9].orientation != 'D') {
              pSVar7 = pSVar7 + iVar9;
              if (pSVar7->length == 1) {
                pSVar7->ID = 'S';
                pSVar7->sRow = row_00;
                pSVar7->sCol = col_00;
                pSVar7->orientation = 'U';
                pSVar7->direction = 0;
                lVar1 = *(long *)&(board->matrix).
                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[row_00].
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data;
                std::__cxx11::string::_M_replace
                          (lVar1 + (long)col_00 * 0x20,0,*(char **)(lVar1 + 8 + (long)col_00 * 0x20)
                           ,0x1060f5);
                goto LAB_00103059;
              }
              ship_00 = *(Ship **)&pSVar7->orientation;
              uVar2 = pSVar7->sRow;
              uVar3 = pSVar7->sCol;
              uVar4 = pSVar7->orientation;
              uVar5 = *(undefined3 *)&pSVar7->field_0x11;
              uVar6 = pSVar7->direction;
              ship.sCol = uVar6;
              ship.sRow._1_3_ = uVar5;
              ship.sRow._0_1_ = uVar4;
              ship.length = uVar3;
              ship._0_4_ = uVar2;
              ship.orientation = (char)in_stack_ffffffffffffff90;
              ship._17_3_ = (int3)((ulong)in_stack_ffffffffffffff90 >> 8);
              ship.direction = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
              bVar11 = val_positioning(board,row_00,col_00,ship);
              if (bVar11) {
                Board::set_position(board,(board->armada).
                                          super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                                          super__Vector_impl_data._M_start + iVar9);
                goto LAB_00103059;
              }
            }
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != board->column * board->row);
      }
      iVar9 = iVar9 + -2;
LAB_00103059:
      iVar9 = iVar9 + 1;
      in_RCX = (ulong)iVar9;
      uVar8 = ((long)(board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (in_RCX <= uVar8 && uVar8 - in_RCX != 0);
  }
  return board;
}

Assistant:

Board *create_Board( Board *board, int row, int col )
{
	  int x, y;//! iterators that'll have their value randomly chosen

    bool permission, control; //! controls the verification loop

    int count; //! control helper so that we can avoid infinite loops

    for( int vec = 0; vec < board->armada.size(); vec++ ) //! positioning each element of the armada from largest to smallest.
    {
        permission = false;
        count = 0;

        while( permission == false )
        {
            if( count == board->row * board->column )
            {
                permission = true;
                vec = vec - 2;
                continue;
            }
            count++;

           	//! controls the generate_random_number seed in order to avoid repetition
            x = generate_random_number( row );
            y = generate_random_number( col ); //! random value from each ship's start (x, y values from Ship class)

            //! first verification of the chosen coordinate
            control = validation( board, x, y, &board->armada[vec] );
            
			if( control == false )
            {;
                permission = false;
                continue;
            }

            //! identify the ship's orientation 
            val_Orientation( board, x, y, &board->armada[vec] );
            
			if( board->armada[vec].orientation == 'D')
            {
                permission = false;
                continue;
            }


            if( ( board->armada[vec].length == 1 ) and ( board->armada[vec].ID = 'S' ) ) //! the submarine needs only of one verification, after that it may be positioned
            {
                board->armada[vec].set_values( x, y, 'U', 0 );
                board->set_position_submarine( &board->armada[vec] );
                permission = true;
                continue;
            } 

            //! validates the positioning of the ship and its shadow
            control = val_positioning( board, x, y, board->armada[vec] );
            
			if( control == false )
            {
                permission = false;
                continue;
            }

            //! plots the ship after all verifications 
            board->set_position( &board->armada[vec] );
            permission = true;

        }

    } 
    return board;
}